

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O2

float miniply::angle_at_vert
                (uint32_t idx,vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> *points2D,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *prev,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *next)

{
  pointer pVVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  pVVar1 = (points2D->super__Vector_base<miniply::Vec2,_std::allocator<miniply::Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  fVar3 = pVVar1[idx].x;
  fVar5 = pVVar1[(next->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start[idx]].x - fVar3;
  fVar4 = pVVar1[idx].y;
  fVar6 = pVVar1[(next->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start[idx]].y - fVar4;
  fVar2 = SQRT(fVar5 * fVar5 + fVar6 * fVar6);
  fVar5 = fVar5 / fVar2;
  fVar6 = fVar6 / fVar2;
  fVar3 = pVVar1[(prev->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start[idx]].x - fVar3;
  fVar4 = pVVar1[(prev->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start[idx]].y - fVar4;
  fVar3 = atan2f(fVar4 * fVar5 - fVar3 * fVar6,fVar3 * fVar5 + fVar4 * fVar6);
  return (float)(-(uint)(fVar3 <= 0.0) & 0x461c4000 |
                ~-(uint)(fVar3 <= 0.0) &
                (-(uint)(3.1415927 <= fVar3) & 0x461c4000 |
                ~-(uint)(3.1415927 <= fVar3) & (uint)fVar3));
}

Assistant:

static float angle_at_vert(uint32_t idx,
                             const std::vector<Vec2>& points2D,
                             const std::vector<uint32_t>& prev,
                             const std::vector<uint32_t>& next)
  {
    Vec2 xaxis = normalize(points2D[next[idx]] - points2D[idx]);
    Vec2 yaxis = Vec2{-xaxis.y, xaxis.x};
    Vec2 p2p0 = points2D[prev[idx]] - points2D[idx];
    float angle = std::atan2(dot(p2p0, yaxis), dot(p2p0, xaxis));
    if (angle <= 0.0f || angle >= kPi) {
      angle = 10000.0f;
    }
    return angle;
  }